

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.h
# Opt level: O2

DecimalFormatProperties * __thiscall
icu_63::number::impl::DecimalFormatProperties::operator=
          (DecimalFormatProperties *this,DecimalFormatProperties *param_1)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int32_t iVar16;
  int32_t iVar17;
  bool bVar18;
  undefined3 uVar19;
  undefined2 uVar20;
  UNumberFormatAttributeValue UVar21;
  
  bVar1 = (param_1->compactStyle).fNull;
  (this->compactStyle).fNull = bVar1;
  if (bVar1 == false) {
    (this->compactStyle).fValue = (param_1->compactStyle).fValue;
  }
  NullableValue<icu_63::CurrencyUnit>::operator=(&this->currency,&param_1->currency);
  CurrencyPluralInfoWrapper::operator=(&this->currencyPluralInfo,&param_1->currencyPluralInfo);
  bVar1 = (param_1->currencyUsage).fNull;
  (this->currencyUsage).fNull = bVar1;
  if (bVar1 == false) {
    (this->currencyUsage).fValue = (param_1->currencyUsage).fValue;
  }
  bVar1 = param_1->decimalPatternMatchRequired;
  bVar13 = param_1->decimalSeparatorAlwaysShown;
  bVar14 = param_1->exponentSignAlwaysShown;
  bVar15 = param_1->formatFailIfMoreThanMaxDigits;
  iVar16 = param_1->formatWidth;
  iVar17 = param_1->groupingSize;
  bVar18 = param_1->groupingUsed;
  uVar19 = *(undefined3 *)&param_1->field_0x4d;
  iVar9 = param_1->magnitudeMultiplier;
  iVar10 = param_1->maximumFractionDigits;
  iVar11 = param_1->maximumIntegerDigits;
  iVar12 = param_1->maximumSignificantDigits;
  iVar5 = param_1->minimumExponentDigits;
  iVar6 = param_1->minimumFractionDigits;
  iVar7 = param_1->minimumGroupingDigits;
  iVar8 = param_1->minimumIntegerDigits;
  iVar2 = param_1->minimumSignificantDigits;
  iVar3 = param_1->multiplier;
  iVar4 = param_1->multiplierScale;
  this->minimumIntegerDigits = param_1->minimumIntegerDigits;
  this->minimumSignificantDigits = iVar2;
  this->multiplier = iVar3;
  this->multiplierScale = iVar4;
  this->minimumExponentDigits = iVar5;
  this->minimumFractionDigits = iVar6;
  this->minimumGroupingDigits = iVar7;
  this->minimumIntegerDigits = iVar8;
  this->magnitudeMultiplier = iVar9;
  this->maximumFractionDigits = iVar10;
  this->maximumIntegerDigits = iVar11;
  this->maximumSignificantDigits = iVar12;
  this->decimalPatternMatchRequired = bVar1;
  this->decimalSeparatorAlwaysShown = bVar13;
  this->exponentSignAlwaysShown = bVar14;
  this->formatFailIfMoreThanMaxDigits = bVar15;
  this->formatWidth = iVar16;
  this->groupingSize = iVar17;
  this->groupingUsed = bVar18;
  *(undefined3 *)&this->field_0x4d = uVar19;
  icu_63::UnicodeString::operator=(&this->negativePrefix,&param_1->negativePrefix);
  icu_63::UnicodeString::operator=(&this->negativePrefixPattern,&param_1->negativePrefixPattern);
  icu_63::UnicodeString::operator=(&this->negativeSuffix,&param_1->negativeSuffix);
  icu_63::UnicodeString::operator=(&this->negativeSuffixPattern,&param_1->negativeSuffixPattern);
  bVar1 = (param_1->padPosition).fNull;
  (this->padPosition).fNull = bVar1;
  if (bVar1 == false) {
    (this->padPosition).fValue = (param_1->padPosition).fValue;
  }
  icu_63::UnicodeString::operator=(&this->padString,&param_1->padString);
  bVar1 = param_1->parseIntegerOnly;
  this->parseCaseSensitive = param_1->parseCaseSensitive;
  this->parseIntegerOnly = bVar1;
  bVar1 = (param_1->parseMode).fNull;
  (this->parseMode).fNull = bVar1;
  if (bVar1 == false) {
    (this->parseMode).fValue = (param_1->parseMode).fValue;
  }
  bVar1 = param_1->parseToBigDecimal;
  uVar20 = *(undefined2 *)&param_1->field_0x1d6;
  UVar21 = param_1->parseAllInput;
  this->parseNoExponent = param_1->parseNoExponent;
  this->parseToBigDecimal = bVar1;
  *(undefined2 *)&this->field_0x1d6 = uVar20;
  this->parseAllInput = UVar21;
  icu_63::UnicodeString::operator=(&this->positivePrefix,&param_1->positivePrefix);
  icu_63::UnicodeString::operator=(&this->positivePrefixPattern,&param_1->positivePrefixPattern);
  icu_63::UnicodeString::operator=(&this->positiveSuffix,&param_1->positiveSuffix);
  icu_63::UnicodeString::operator=(&this->positiveSuffixPattern,&param_1->positiveSuffixPattern);
  this->roundingIncrement = param_1->roundingIncrement;
  bVar1 = (param_1->roundingMode).fNull;
  (this->roundingMode).fNull = bVar1;
  if (bVar1 == false) {
    (this->roundingMode).fValue = (param_1->roundingMode).fValue;
  }
  this->signAlwaysShown = param_1->signAlwaysShown;
  this->secondaryGroupingSize = param_1->secondaryGroupingSize;
  return this;
}

Assistant:

struct U_I18N_API DecimalFormatProperties : public UMemory {

  public:
    NullableValue<UNumberCompactStyle> compactStyle;
    NullableValue<CurrencyUnit> currency;
    CurrencyPluralInfoWrapper currencyPluralInfo;
    NullableValue<UCurrencyUsage> currencyUsage;
    bool decimalPatternMatchRequired;
    bool decimalSeparatorAlwaysShown;
    bool exponentSignAlwaysShown;
    bool formatFailIfMoreThanMaxDigits; // ICU4C-only
    int32_t formatWidth;
    int32_t groupingSize;
    bool groupingUsed;
    int32_t magnitudeMultiplier; // internal field like multiplierScale but separate to avoid conflict
    int32_t maximumFractionDigits;
    int32_t maximumIntegerDigits;
    int32_t maximumSignificantDigits;
    int32_t minimumExponentDigits;
    int32_t minimumFractionDigits;
    int32_t minimumGroupingDigits;
    int32_t minimumIntegerDigits;
    int32_t minimumSignificantDigits;
    int32_t multiplier;
    int32_t multiplierScale; // ICU4C-only
    UnicodeString negativePrefix;
    UnicodeString negativePrefixPattern;
    UnicodeString negativeSuffix;
    UnicodeString negativeSuffixPattern;
    NullableValue<PadPosition> padPosition;
    UnicodeString padString;
    bool parseCaseSensitive;
    bool parseIntegerOnly;
    NullableValue<ParseMode> parseMode;
    bool parseNoExponent;
    bool parseToBigDecimal; // TODO: Not needed in ICU4C?
    UNumberFormatAttributeValue parseAllInput; // ICU4C-only
    //PluralRules pluralRules;
    UnicodeString positivePrefix;
    UnicodeString positivePrefixPattern;
    UnicodeString positiveSuffix;
    UnicodeString positiveSuffixPattern;
    double roundingIncrement;
    NullableValue<RoundingMode> roundingMode;
    int32_t secondaryGroupingSize;
    bool signAlwaysShown;

    DecimalFormatProperties();

    inline bool operator==(const DecimalFormatProperties& other) const {
        return _equals(other, false);
    }

    void clear();

    /**
     * Checks for equality to the default DecimalFormatProperties, but ignores the prescribed set of
     * options for fast-path formatting.
     */
    bool equalsDefaultExceptFastFormat() const;

  private:
    bool _equals(const DecimalFormatProperties& other, bool ignoreForFastFormat) const;
}